

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  LodePNGColorType LVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  LodePNGColorProfile prof;
  
  prof.alpha = 0;
  prof.numcolors = 0;
  prof.colored = 0;
  prof.key._0_2_ = 0;
  prof.key._2_2_ = 0;
  prof.key_r = 0;
  prof.key_g = 0;
  prof.key_b = 0;
  prof.bits = 1;
  lodepng_get_color_profile(&prof,image,w,h,mode_in);
  mode_out->key_defined = 0;
  iVar1 = CONCAT22(prof.key._2_2_,(undefined2)prof.key);
  if (h * w < 0x11 && iVar1 != 0) {
    prof.alpha = 1;
    prof.key._0_2_ = 0;
    prof.key._2_2_ = 0;
    uVar2 = 8;
    if (8 < prof.bits) {
      uVar2 = prof.bits;
    }
    iVar1 = 0;
    prof.bits = uVar2;
  }
  uVar5 = (ulong)prof.numcolors;
  if (uVar5 < 3) {
    uVar2 = 1;
  }
  else if (prof.numcolors < 5) {
    uVar2 = 2;
  }
  else {
    uVar2 = (uint)(0x10 < prof.numcolors) * 4 + 4;
  }
  if (((uVar2 < prof.bits || prof.colored != 0) &&
      (prof.numcolors * 2 <= h * w && prof.numcolors < 0x101)) && prof.bits < 9) {
    lodepng_palette_clear(mode_out);
    uVar3 = 0;
    do {
      uVar6 = 0;
      if (uVar5 == uVar3) break;
      uVar6 = lodepng_palette_add(mode_out,prof.palette[uVar3 * 4],prof.palette[uVar3 * 4 + 1],
                                  prof.palette[uVar3 * 4 + 2],prof.palette[uVar3 * 4 + 3]);
      uVar3 = uVar3 + 1;
    } while (uVar6 == 0);
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar2;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar2)) {
      lodepng_palette_clear(mode_out);
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  else {
    bVar7 = prof.colored != 0;
    mode_out->bitdepth = prof.bits;
    LVar4 = bVar7 + 4 + (uint)bVar7;
    if (prof.alpha == 0) {
      LVar4 = (uint)bVar7 * 2;
    }
    mode_out->colortype = LVar4;
    uVar6 = 0;
    if (iVar1 != 0) {
      uVar2 = ~(-1 << ((byte)prof.bits & 0x1f));
      mode_out->key_r = prof.key_r & uVar2;
      mode_out->key_g = prof.key_g & uVar2;
      mode_out->key_b = prof.key_b & uVar2;
      mode_out->key_defined = 1;
    }
  }
  return uVar6;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  LodePNGColorProfile prof;
  unsigned error = 0;
  unsigned i, n, palettebits, palette_ok;

  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  mode_out->key_defined = 0;

  if(prof.key && w * h <= 16)
  {
    prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    prof.key = 0;
    if(prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  n = prof.numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && prof.bits <= 8;
  if(w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(!prof.colored && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    unsigned char* p = prof.palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof.numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = prof.bits;
    mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                     : (prof.colored ? LCT_RGB : LCT_GREY);

    if(prof.key)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof.key_r & mask;
      mode_out->key_g = prof.key_g & mask;
      mode_out->key_b = prof.key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}